

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

void __thiscall
QIconModeViewBase::scrollContentsBy(QIconModeViewBase *this,int dx,int dy,bool scrollElasticBand)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  QWidget *rect;
  byte in_CL;
  int in_ESI;
  QCommonListViewBase *in_RDI;
  long in_FS_OFFSET;
  QRect QVar4;
  undefined8 in_stack_ffffffffffffffa0;
  undefined1 uVar5;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  QListViewPrivate *in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffc0;
  QCommonListViewBase *pQVar6;
  
  uVar5 = (undefined1)((ulong)in_stack_ffffffffffffffa0 >> 0x38);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_CL & 1;
  pQVar6 = in_RDI;
  if (bVar2 != 0) {
    in_stack_ffffffffffffffb0 = in_RDI->dd;
    bVar3 = QCommonListViewBase::isRightToLeft((QCommonListViewBase *)0x88647f);
    in_stack_ffffffffffffffac = in_ESI;
    if (bVar3) {
      in_stack_ffffffffffffffac = -in_ESI;
    }
    QListViewPrivate::scrollElasticBandBy
              ((QListViewPrivate *)CONCAT17(bVar2,in_stack_ffffffffffffffc0),
               (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  }
  QCommonListViewBase::scrollContentsBy
            ((QCommonListViewBase *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
             in_stack_ffffffffffffffa8,(bool)uVar5);
  bVar3 = QList<QModelIndex>::isEmpty((QList<QModelIndex> *)0x8864d7);
  if (!bVar3) {
    rect = QCommonListViewBase::viewport(in_RDI);
    QVar4 = draggedItemsRect((QIconModeViewBase *)in_stack_ffffffffffffffb0);
    QRect::translated(QVar4._0_8_,(int)((ulong)pQVar6 >> 0x20),(int)pQVar6);
    QWidget::update((QWidget *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                    (QRect *)rect);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QIconModeViewBase::scrollContentsBy(int dx, int dy, bool scrollElasticBand)
{
    if (scrollElasticBand)
        dd->scrollElasticBandBy(isRightToLeft() ? -dx : dx, dy);

    QCommonListViewBase::scrollContentsBy(dx, dy, scrollElasticBand);
    if (!draggedItems.isEmpty())
        viewport()->update(draggedItemsRect().translated(dx, dy));
}